

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  undefined4 uVar4;
  sqlite3_value *psVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  sqlite3_str *p;
  char *pcVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  psVar5 = *argv;
  uVar1._0_2_ = psVar5->flags;
  uVar1._2_1_ = psVar5->enc;
  uVar1._3_1_ = psVar5->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    return;
  }
  if ((short)context->pMem->flags < 0) {
    p = (sqlite3_str *)context->pMem->z;
  }
  else {
    p = (sqlite3_str *)createAggContext(context,0x30);
  }
  if (p == (sqlite3_str *)0x0) {
    return;
  }
  uVar2 = p->mxAlloc;
  p->mxAlloc = context->pOut->db->aLimit[0];
  if (argc == 1) {
    if (uVar2 == 0) {
      *(undefined4 *)((long)&p[1].db + 4) = 1;
    }
    else {
      sqlite3_str_appendchar(p,1,',');
    }
    goto LAB_001b81bd;
  }
  if (uVar2 == 0) {
    iVar8 = sqlite3ValueBytes(argv[1],'\x01');
    *(int *)((long)&p[1].db + 4) = iVar8;
    goto LAB_001b81bd;
  }
  pcVar9 = (char *)sqlite3ValueText(argv[1],'\x01');
  iVar8 = sqlite3ValueBytes(argv[1],'\x01');
  if (pcVar9 == (char *)0x0) {
    iVar8 = 0;
  }
  else {
    sqlite3_str_append(p,pcVar9,iVar8);
  }
  pcVar9 = p[1].zText;
  if (iVar8 == *(int *)((long)&p[1].db + 4)) {
    if (pcVar9 == (char *)0x0) goto LAB_001b81bd;
LAB_001b8168:
    iVar3 = *(int *)&p[1].db;
    iVar7 = sqlite3_initialize();
    if ((iVar7 == 0) &&
       (pcVar9 = (char *)sqlite3Realloc(pcVar9,(long)iVar3 << 2), pcVar9 != (char *)0x0)) {
LAB_001b8189:
      if (0 < *(int *)&p[1].db) {
        *(int *)(pcVar9 + (ulong)(*(int *)&p[1].db - 1) * 4) = iVar8;
      }
      p[1].zText = pcVar9;
      goto LAB_001b81bd;
    }
  }
  else {
    if (pcVar9 != (char *)0x0) goto LAB_001b8168;
    iVar3 = *(int *)&p[1].db;
    iVar7 = sqlite3_initialize();
    if ((iVar7 == 0) &&
       (pcVar9 = (char *)sqlite3Malloc((long)iVar3 * 4 + 4), auVar6 = _DAT_001e3de0,
       pcVar9 != (char *)0x0)) {
      iVar3 = *(int *)&p[1].db;
      if (1 < iVar3) {
        uVar4 = *(undefined4 *)((long)&p[1].db + 4);
        lVar10 = (ulong)(iVar3 - 1) - 1;
        auVar11._8_4_ = (int)lVar10;
        auVar11._0_8_ = lVar10;
        auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar11 = auVar11 ^ _DAT_001e3de0;
        auVar12 = _DAT_001e3dc0;
        auVar14 = _DAT_001e3dd0;
        do {
          auVar15 = auVar14 ^ auVar6;
          iVar7 = auVar11._4_4_;
          if ((bool)(~(auVar15._4_4_ == iVar7 && auVar11._0_4_ < auVar15._0_4_ ||
                      iVar7 < auVar15._4_4_) & 1)) {
            *(undefined4 *)(pcVar9 + lVar10) = uVar4;
          }
          if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
              auVar15._12_4_ <= auVar11._12_4_) {
            *(undefined4 *)(pcVar9 + lVar10 + 4) = uVar4;
          }
          auVar15 = auVar12 ^ auVar6;
          iVar16 = auVar15._4_4_;
          if (iVar16 <= iVar7 && (iVar16 != iVar7 || auVar15._0_4_ <= auVar11._0_4_)) {
            *(undefined4 *)(pcVar9 + lVar10 + 8) = uVar4;
            *(undefined4 *)(pcVar9 + lVar10 + 0xc) = uVar4;
          }
          lVar13 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar13 + 4;
          lVar13 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 4;
          auVar12._8_8_ = lVar13 + 4;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)(iVar3 + 2U >> 2) << 4 != lVar10);
      }
      goto LAB_001b8189;
    }
  }
  p->accError = '\a';
  if (p->mxAlloc != 0) {
    sqlite3_str_reset(p);
  }
LAB_001b81bd:
  *(int *)&p[1].db = *(int *)&p[1].db + 1;
  pcVar9 = (char *)sqlite3ValueText(*argv,'\x01');
  iVar8 = sqlite3ValueBytes(*argv,'\x01');
  if (pcVar9 == (char *)0x0) {
    return;
  }
  sqlite3_str_append(p,pcVar9,iVar8);
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  GroupConcatCtx *pGCC;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  if( pGCC ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pGCC->str.mxAlloc==0;
    pGCC->str.mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( argc==1 ){
      if( !firstTerm ){
        sqlite3_str_appendchar(&pGCC->str, 1, ',');
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        pGCC->nFirstSepLength = 1;
      }
#endif
    }else if( !firstTerm ){
      zSep = (char*)sqlite3_value_text(argv[1]);
      nSep = sqlite3_value_bytes(argv[1]);
      if( zSep ){
        sqlite3_str_append(&pGCC->str, zSep, nSep);
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        nSep = 0;
      }
      if( nSep != pGCC->nFirstSepLength || pGCC->pnSepLengths != 0 ){
        int *pnsl = pGCC->pnSepLengths;
        if( pnsl == 0 ){
          /* First separator length variation seen, start tracking them. */
          pnsl = (int*)sqlite3_malloc64((pGCC->nAccum+1) * sizeof(int));
          if( pnsl!=0 ){
            int i = 0, nA = pGCC->nAccum-1;
            while( i<nA ) pnsl[i++] = pGCC->nFirstSepLength;
          }
        }else{
          pnsl = (int*)sqlite3_realloc64(pnsl, pGCC->nAccum * sizeof(int));
        }
        if( pnsl!=0 ){
          if( ALWAYS(pGCC->nAccum>0) ){
            pnsl[pGCC->nAccum-1] = nSep;
          }
          pGCC->pnSepLengths = pnsl;
        }else{
          sqlite3StrAccumSetError(&pGCC->str, SQLITE_NOMEM);
        }
      }
#endif
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    else{
      pGCC->nFirstSepLength = sqlite3_value_bytes(argv[1]);
    }
    pGCC->nAccum += 1;
#endif
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    if( zVal ) sqlite3_str_append(&pGCC->str, zVal, nVal);
  }
}